

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_form_suite.cpp
# Opt level: O1

void __thiscall reader_query_form_suite::test_single_space::test_method(test_single_space *this)

{
  view_type *pvVar1;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  undefined1 local_224 [4];
  view_type local_220;
  undefined1 local_210;
  undefined8 *local_208;
  view_type *local_200;
  undefined **local_1f8;
  undefined1 local_1f0;
  undefined8 *local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined **local_1b8;
  undefined1 local_1b0;
  undefined8 *local_1a8;
  char *local_1a0;
  view_type *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  shared_count sStack_178;
  basic_query_form<char> local_170;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  char input [22];
  
  builtin_strncpy(input,"alpha=hydrogen+helium",0x16);
  local_170.super_base<char,_trial::url::reader::basic_query_form>.input.len_ = strlen(input);
  local_170.super_base<char,_trial::url::reader::basic_query_form>.current_token = end;
  local_170.super_base<char,_trial::url::reader::basic_query_form>._36_1_ = 1;
  local_170.super_base<char,_trial::url::reader::basic_query_form>.input.ptr_ = input;
  local_170.super_base<char,_trial::url::reader::basic_query_form>.current_view.ptr_ = input;
  local_170.super_base<char,_trial::url::reader::basic_query_form>.current_view.len_ =
       local_170.super_base<char,_trial::url::reader::basic_query_form>.input.len_;
  trial::url::reader::basic_query_form<char>::do_next(&local_170);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x30);
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00186260;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  local_198 = &local_220;
  local_220.ptr_ =
       (char *)CONCAT44(local_220.ptr_._4_4_,
                        local_170.super_base<char,_trial::url::reader::basic_query_form>.
                        current_token);
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_224;
  local_224 = (undefined1  [4])0xa;
  local_1d8._M_dataplus._M_p._0_1_ =
       local_170.super_base<char,_trial::url::reader::basic_query_form>.current_token ==
       query_form_key;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_180 = "";
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_00186618;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_210 = '\0';
  local_200 = (view_type *)&local_230;
  local_220.len_ = (size_t)&PTR__lazy_ostream_00186618;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_198;
  boost::test_tools::tt_detail::report_assertion();
  pvVar1 = &local_170.super_base<char,_trial::url::reader::basic_query_form>.current_view;
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_78,0x31);
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00186260;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  if (local_170.super_base<char,_trial::url::reader::basic_query_form>.current_view.len_ == 5) {
    iVar3 = bcmp(local_170.super_base<char,_trial::url::reader::basic_query_form>.current_view.ptr_,
                 "alpha",5);
    local_1d8._M_dataplus._M_p._0_1_ = iVar3 == 0;
  }
  else {
    local_1d8._M_dataplus._M_p._0_1_ = false;
  }
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_180 = "";
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_00186598;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x172ea2;
  local_210 = '\0';
  local_220.len_ = (size_t)&PTR__lazy_ostream_00186498;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = (view_type *)&local_230;
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_198;
  local_198 = pvVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d8,&local_1b8,&local_188,0x31,2,2,2,"reader.literal()",&local_1f8,"\"alpha\"",
             &local_220.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x32);
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00186260;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  trial::url::reader::detail::
  converter<char,_trial::url::reader::basic_query_form,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_1d8,pvVar1);
  iVar3 = std::__cxx11::string::compare((char *)&local_1d8);
  local_188 = (char *)CONCAT71(local_188._1_7_,iVar3 == 0);
  local_180 = (char *)0x0;
  sStack_178.pi_ = (sp_counted_base *)0x0;
  local_198 = (view_type *)0x173554;
  local_190 = "";
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_001862d8;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_230;
  local_220.ptr_ = "alpha";
  local_210 = '\0';
  local_220.len_ = (size_t)&PTR__lazy_ostream_00186498;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = &local_220;
  local_230 = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,&local_1b8,&local_198,0x32,2,2,2,"reader.value<std::string>()",&local_1f8,
             "\"alpha\"",&local_220.len_);
  boost::detail::shared_count::~shared_count(&sStack_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_) !=
      &local_1d8.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_),
                    local_1d8.field_2._M_allocated_capacity + 1);
  }
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x33);
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00186260;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  local_1d8._M_dataplus._M_p._0_1_ = trial::url::reader::basic_query_form<char>::do_next(&local_170)
  ;
  local_220.ptr_ = (char *)CONCAT71(local_220.ptr_._1_7_,local_1d8._M_dataplus._M_p._0_1_);
  local_224[0] = 1;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_180 = "";
  local_198 = &local_220;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_001865d8;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_224;
  local_210 = '\0';
  local_220.len_ = (size_t)&PTR__lazy_ostream_001865d8;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = (view_type *)&local_230;
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d8,&local_1b8,&local_188,0x33,2,2,2,"reader.next()",&local_1f8,"true",
             &local_220.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0x34);
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00186260;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  local_1d8._M_dataplus._M_p._0_1_ =
       local_170.super_base<char,_trial::url::reader::basic_query_form>.current_token ==
       query_form_value;
  local_220.ptr_ =
       (char *)CONCAT44(local_220.ptr_._4_4_,
                        local_170.super_base<char,_trial::url::reader::basic_query_form>.
                        current_token);
  local_224 = (undefined1  [4])0xb;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_180 = "";
  local_198 = &local_220;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_00186618;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_224;
  local_210 = '\0';
  local_220.len_ = (size_t)&PTR__lazy_ostream_00186618;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = (view_type *)&local_230;
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d8,&local_1b8,&local_188,0x34,2,2,2,"reader.subcode()",&local_1f8,
             "url::token::subcode::query_form_value",&local_220.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f8,0x35);
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00186260;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  if (local_170.super_base<char,_trial::url::reader::basic_query_form>.current_view.len_ == 0xf) {
    iVar3 = bcmp(local_170.super_base<char,_trial::url::reader::basic_query_form>.current_view.ptr_,
                 "hydrogen+helium",0xf);
    local_1d8._M_dataplus._M_p._0_1_ = iVar3 == 0;
  }
  else {
    local_1d8._M_dataplus._M_p._0_1_ = false;
  }
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_180 = "";
  pvVar1 = &local_170.super_base<char,_trial::url::reader::basic_query_form>.current_view;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_00186598;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x173642;
  local_210 = '\0';
  local_220.len_ = (size_t)&PTR__lazy_ostream_00186b58;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = (view_type *)&local_230;
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_198;
  local_198 = pvVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d8,&local_1b8,&local_188,0x35,2,2,2,"reader.literal()",&local_1f8,
             "\"hydrogen+helium\"",&local_220.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x36);
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00186260;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  trial::url::reader::detail::
  converter<char,_trial::url::reader::basic_query_form,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_1d8,pvVar1);
  iVar3 = std::__cxx11::string::compare((char *)&local_1d8);
  local_188 = (char *)CONCAT71(local_188._1_7_,iVar3 == 0);
  local_180 = (char *)0x0;
  sStack_178.pi_ = (sp_counted_base *)0x0;
  local_198 = (view_type *)0x173554;
  local_190 = "";
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_001862d8;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_230;
  local_220.ptr_ = "hydrogen helium";
  local_210 = '\0';
  local_220.len_ = (size_t)&PTR__lazy_ostream_00186b58;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = &local_220;
  local_230 = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_188,&local_1b8,&local_198,0x36,2,2,2,"reader.value<std::string>()",&local_1f8,
             "\"hydrogen helium\"",&local_220.len_);
  boost::detail::shared_count::~shared_count(&sStack_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_) !=
      &local_1d8.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_),
                    local_1d8.field_2._M_allocated_capacity + 1);
  }
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x37);
  local_1b0 = 0;
  local_1b8 = &PTR__lazy_ostream_00186260;
  local_1a8 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  bVar2 = trial::url::reader::basic_query_form<char>::do_next(&local_170);
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_224;
  local_220.ptr_ = (char *)CONCAT71(local_220.ptr_._1_7_,bVar2);
  local_224 = (undefined1  [4])((uint)local_224 & 0xffffff00);
  local_1d8._M_dataplus._M_p._0_1_ = !bVar2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/query_form_suite.cpp"
  ;
  local_180 = "";
  local_198 = &local_220;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_001865d8;
  local_1e8 = &boost::unit_test::lazy_ostream::inst;
  local_210 = '\0';
  local_220.len_ = (size_t)&PTR__lazy_ostream_001865d8;
  local_208 = &boost::unit_test::lazy_ostream::inst;
  local_200 = (view_type *)&local_230;
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d8,&local_1b8,&local_188,0x37,2,2,2,"reader.next()",&local_1f8,"false",
             &local_220.len_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d8.field_2._M_allocated_capacity);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_single_space)
{
    const char input[] = "alpha=hydrogen+helium";
    url::reader::query_form reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::query_form_key);
    BOOST_REQUIRE_EQUAL(reader.literal(), "alpha");
    BOOST_REQUIRE_EQUAL(reader.value<std::string>(), "alpha");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::query_form_value);
    BOOST_REQUIRE_EQUAL(reader.literal(), "hydrogen+helium");
    BOOST_REQUIRE_EQUAL(reader.value<std::string>(), "hydrogen helium");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}